

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip4.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnIPv4::Append(ColumnIPv4 *this,string *str)

{
  in_addr_t __hostlong;
  char *__cp;
  runtime_error *this_00;
  element_type *value;
  in_addr_t addr;
  ColumnVector<unsigned_int> *in_stack_ffffffffffffffa0;
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  __cp = (char *)std::__cxx11::string::c_str();
  __hostlong = inet_addr(__cp);
  if (__hostlong == 0xffffffff) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)CONCAT44(__hostlong,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0)
    ;
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  value = std::
          __shared_ptr_access<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x210020);
  htonl(__hostlong);
  ColumnVector<unsigned_int>::Append(in_stack_ffffffffffffffa0,(uint *)value);
  return;
}

Assistant:

void ColumnIPv4::Append(const std::string& str) {
    in_addr_t addr = inet_addr(str.c_str());
    if (addr == INADDR_NONE) {
        throw std::runtime_error("invalid IPv4 format, ip: " + str);
    }
    data_->Append(htonl(addr));
}